

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.h
# Opt level: O0

bool __thiscall text_subtitles::YUVQuad::operator<(YUVQuad *this,YUVQuad *second)

{
  YUVQuad *second_local;
  YUVQuad *this_local;
  
  if (this->Y == second->Y) {
    if (this->Cr == second->Cr) {
      if (this->Cb == second->Cb) {
        this_local._7_1_ = this->alpha < second->alpha;
      }
      else {
        this_local._7_1_ = this->Cb < second->Cb;
      }
    }
    else {
      this_local._7_1_ = this->Cr < second->Cr;
    }
  }
  else {
    this_local._7_1_ = this->Y < second->Y;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const YUVQuad& second) const
    {
        if (Y != second.Y)
            return Y < second.Y;
        if (Cr != second.Cr)
            return Cr < second.Cr;
        if (Cb != second.Cb)
            return Cb < second.Cb;

        return alpha < second.alpha;
    }